

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioParse.c
# Opt level: O2

Vec_Int_t * Mio_ParseFormula(char *pFormInit,char **ppVarNames,int nVars)

{
  char cVar1;
  int *piVar2;
  byte bVar3;
  int iVar4;
  int Entry;
  int Entry_00;
  size_t sVar5;
  byte *__s;
  Vec_Ptr_t *p;
  void **ppvVar6;
  Vec_Int_t *p_00;
  size_t sVar7;
  Vec_Int_t *pVVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  byte *__ptr;
  bool bVar12;
  size_t sStack_80;
  int local_64;
  Vec_Int_t *pStackOp;
  Vec_Ptr_t *pStackFn;
  byte *local_50;
  long local_48;
  ulong local_40;
  char **local_38;
  
  iVar4 = 0;
  pcVar10 = pFormInit;
  do {
    cVar1 = *pcVar10;
    if (cVar1 == '(') {
      iVar4 = iVar4 + 1;
    }
    else if (cVar1 == ')') {
      iVar4 = iVar4 + -1;
    }
    else if (cVar1 == '\0') break;
    pcVar10 = pcVar10 + 1;
  } while( true );
  local_38 = ppVarNames;
  if (iVar4 != 0) {
    fwrite("Mio_ParseFormula(): Different number of opening and closing parentheses ().\n",0x4c,1,
           _stdout);
    return (Vec_Int_t *)0x0;
  }
  sVar5 = strlen(pFormInit);
  __s = (byte *)malloc(sVar5 + 3);
  sprintf((char *)__s,"(%s)",pFormInit);
  p = (Vec_Ptr_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  p->pArray = ppvVar6;
  pStackFn = p;
  p_00 = Vec_IntAlloc(100);
  iVar4 = 0;
  if (0 < nVars) {
    iVar4 = nVars;
  }
  local_40 = (ulong)(uint)(iVar4 * 2);
  iVar4 = 1;
  local_64 = -1;
  __ptr = __s;
  pStackOp = p_00;
LAB_006ee1e0:
  bVar3 = *__s;
  switch(bVar3) {
  case 0x20:
    break;
  case 0x21:
    if (iVar4 == 2) {
      Vec_IntPush(p_00,9);
      iVar4 = 10;
      goto LAB_006ee407;
    }
    Vec_IntPush(p_00,10);
    if (iVar4 == 1) {
      iVar4 = 1;
      break;
    }
    goto LAB_006ee412;
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
switchD_006ee1fb_caseD_22:
    local_48 = -0x100000000;
    sVar5 = 0;
    do {
      if (bVar3 < 0x2c) {
        if ((0xec100002601U >> ((ulong)bVar3 & 0x3f) & 1) != 0) goto LAB_006ee2d0;
        if ((0x10200000000U >> ((ulong)bVar3 & 0x3f) & 1) != 0) {
          local_50 = __ptr;
          fwrite("Mio_ParseFormula(): The negation sign or an opening parenthesis inside the variable name.\n"
                 ,0x5a,1,_stdout);
          bVar12 = false;
          goto LAB_006ee2df;
        }
      }
      if ((bVar3 == 0x5e) || (bVar3 == 0x7c)) goto LAB_006ee2d0;
      bVar3 = __s[sVar5 + 1];
      sVar5 = sVar5 + 1;
      local_48 = local_48 + 0x100000000;
    } while( true );
  case 0x26:
  case 0x2a:
  case 0x2b:
switchD_006ee1fb_caseD_26:
    if (iVar4 != 2) {
      pcVar10 = "Mio_ParseFormula(): There is no variable before AND, EXOR, or OR.\n";
      sStack_80 = 0x42;
      goto LAB_006ee551;
    }
    iVar4 = 9;
    if ((bVar3 != 0x26) && (bVar3 != 0x2a)) {
      if ((bVar3 == 0x7c) || (bVar3 == 0x2b)) {
        iVar4 = 7;
      }
      else {
        iVar4 = 8;
      }
    }
LAB_006ee407:
    Vec_IntPush(p_00,iVar4);
    iVar4 = 3;
LAB_006ee412:
    while (Entry = Vec_IntPop(p_00), p_00->nSize != 0) {
      pVVar8 = p_00;
      Entry_00 = Vec_IntPop(p_00);
      if (Entry_00 < Entry) {
        Vec_IntPush(p_00,Entry_00);
        break;
      }
      pVVar8 = Mio_ParseFormulaOper(&pVVar8->nCap,nVars,p,Entry_00);
      if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_006ee53e;
      Vec_IntPush(p_00,Entry);
    }
LAB_006ee465:
    Vec_IntPush(p_00,Entry);
    break;
  case 0x27:
    if (iVar4 == 2) {
      local_50 = __ptr;
      pVVar8 = (Vec_Int_t *)Vec_PtrPop(p);
      Exp_Not(pVVar8);
      goto LAB_006ee4b7;
    }
    pcVar10 = "Mio_ParseFormula(): No variable is specified before the negation suffix.\n";
    sStack_80 = 0x49;
    goto LAB_006ee551;
  case 0x28:
    if (iVar4 == 2) {
      Vec_IntPush(p_00,9);
    }
    iVar4 = 1;
    Entry = 1;
    goto LAB_006ee465;
  case 0x29:
    if (p_00->nSize != 0) {
      iVar4 = 1;
      while( true ) {
        if (iVar4 == 0) goto LAB_006ee5ac;
        pVVar8 = p_00;
        iVar4 = Vec_IntPop(p_00);
        if (iVar4 == 1) break;
        pVVar8 = Mio_ParseFormulaOper(&pVVar8->nCap,nVars,p,iVar4);
        if (pVVar8 == (Vec_Int_t *)0x0) goto LAB_006ee53e;
        iVar4 = p_00->nSize;
      }
      goto LAB_006ee4e7;
    }
LAB_006ee5ac:
    pcVar10 = "Mio_ParseFormula(): There is no opening parenthesis\n";
    sStack_80 = 0x34;
    goto LAB_006ee551;
  case 0x30:
    pVVar8 = Vec_IntAlloc(1);
    Vec_IntPush(pVVar8,-1);
    Vec_PtrPush(p,pVVar8);
    if (iVar4 != 2) goto LAB_006ee4e7;
    pcVar10 = "Mio_ParseFormula(): No operation symbol before constant 0.\n";
    goto LAB_006ee615;
  case 0x31:
    pVVar8 = Vec_IntAlloc(1);
    Vec_IntPush(pVVar8,-2);
    Vec_PtrPush(p,pVVar8);
    if (iVar4 != 2) goto LAB_006ee4e7;
    pcVar10 = "Mio_ParseFormula(): No operation symbol before constant 1.\n";
LAB_006ee615:
    sStack_80 = 0x3b;
LAB_006ee551:
    fwrite(pcVar10,sStack_80,1,_stdout);
LAB_006ee57c:
    free(__ptr);
    Vec_PtrFreeP(&pStackFn);
    Vec_IntFreeP(&pStackOp);
    return (Vec_Int_t *)0x0;
  default:
    if ((1 < bVar3 - 9) && (bVar3 != 0xd)) {
      if ((bVar3 == 0x5e) || (bVar3 == 0x7c)) goto switchD_006ee1fb_caseD_26;
      if (bVar3 != 0) goto switchD_006ee1fb_caseD_22;
      if (p->nSize == 0) {
        pcVar10 = "Mio_ParseFormula(): The input string is empty\n";
        sStack_80 = 0x2e;
      }
      else {
        pVVar8 = (Vec_Int_t *)Vec_PtrPop(p);
        if (p->nSize == 0) {
          if (p_00->nSize == 0) {
            free(__ptr);
            Vec_PtrFreeP(&pStackFn);
            Vec_IntFreeP(&pStackOp);
            for (lVar9 = 0; lVar9 < pVVar8->nSize / 2; lVar9 = lVar9 + 1) {
              piVar2 = pVVar8->pArray;
              iVar4 = piVar2[lVar9];
              piVar2[lVar9] = piVar2[pVVar8->nSize + local_64];
              piVar2[pVVar8->nSize + local_64] = iVar4;
              local_64 = local_64 + -1;
            }
            return pVVar8;
          }
          pcVar10 = "Mio_ParseFormula(): Something is left in the operation stack\n";
          sStack_80 = 0x3d;
        }
        else {
          pcVar10 = "Mio_ParseFormula(): Something is left in the function stack\n";
          sStack_80 = 0x3c;
        }
      }
      goto LAB_006ee551;
    }
  }
switchD_006ee1fb_caseD_20:
  __s = __s + 1;
  goto LAB_006ee1e0;
LAB_006ee2d0:
  bVar12 = iVar4 == 2;
  local_50 = __ptr;
LAB_006ee2df:
  uVar11 = 0;
  while( true ) {
    if (local_40 == uVar11) {
      fprintf(_stdout,
              "Mio_ParseFormula(): The parser cannot find var \"%s\" in the input var list.\n",__s);
      __ptr = local_50;
      goto LAB_006ee57c;
    }
    pcVar10 = *(char **)((long)local_38 + uVar11 * 4);
    iVar4 = strncmp((char *)__s,pcVar10,sVar5);
    if ((iVar4 == 0) && (sVar7 = strlen(pcVar10), sVar7 == sVar5)) break;
    uVar11 = uVar11 + 2;
  }
  if (bVar12) {
    Vec_IntPush(p_00,9);
  }
  __s = __s + (local_48 >> 0x20);
  pVVar8 = Vec_IntAlloc(1);
  Vec_IntPush(pVVar8,(int)uVar11);
LAB_006ee4b7:
  Vec_PtrPush(p,pVVar8);
  __ptr = local_50;
LAB_006ee4e7:
  while (p_00->nSize != 0) {
    iVar4 = Vec_IntPop(p_00);
    if (iVar4 != 10) {
      Vec_IntPush(p_00,iVar4);
      break;
    }
    pVVar8 = (Vec_Int_t *)Vec_PtrPop(p);
    Exp_Not(pVVar8);
    Vec_PtrPush(p,pVVar8);
  }
  iVar4 = 2;
  goto switchD_006ee1fb_caseD_20;
LAB_006ee53e:
  pcVar10 = "Mio_ParseFormula(): Unknown operation\n";
  sStack_80 = 0x26;
  goto LAB_006ee551;
}

Assistant:

Vec_Int_t * Mio_ParseFormula( char * pFormInit, char ** ppVarNames, int nVars )
{
    char * pFormula;
    int Man = nVars, * pMan = &Man;
    Vec_Ptr_t * pStackFn;
    Vec_Int_t * pStackOp;
    Vec_Int_t * gFunc;
    char * pTemp, * pName;
    int nParans, fFound, Flag;
    int Oper, Oper1, Oper2;
    int i, v;

    // make sure that the number of opening and closing parentheses is the same
    nParans = 0;
    for ( pTemp = pFormInit; *pTemp; pTemp++ )
        if ( *pTemp == '(' )
            nParans++;
        else if ( *pTemp == ')' )
            nParans--;
    if ( nParans != 0 )
    {
        fprintf( stdout, "Mio_ParseFormula(): Different number of opening and closing parentheses ().\n" );
        return NULL;
    }

    // copy the formula
    pFormula = ABC_ALLOC( char, strlen(pFormInit) + 3 );
    sprintf( pFormula, "(%s)", pFormInit );

    // start the stacks
    pStackFn = Vec_PtrAlloc( 100 );
    pStackOp = Vec_IntAlloc( 100 );

    Flag = MIO_EQN_FLAG_START;
    for ( pTemp = pFormula; *pTemp; pTemp++ )
    {
        switch ( *pTemp )
        {
        // skip all spaces, tabs, and end-of-lines
        case ' ':
        case '\t':
        case '\r':
        case '\n':
            continue;
        case MIO_EQN_SYM_CONST0:
            Vec_PtrPush( pStackFn, Exp_Const0() );  // Cudd_Ref( b0 );
            if ( Flag == MIO_EQN_FLAG_VAR )
            {
                fprintf( stdout, "Mio_ParseFormula(): No operation symbol before constant 0.\n" );
                Flag = MIO_EQN_FLAG_ERROR; 
                break;
            }
            Flag = MIO_EQN_FLAG_VAR; 
            break;
        case MIO_EQN_SYM_CONST1:
            Vec_PtrPush( pStackFn, Exp_Const1() );  //  Cudd_Ref( b1 );
            if ( Flag == MIO_EQN_FLAG_VAR )
            {
                fprintf( stdout, "Mio_ParseFormula(): No operation symbol before constant 1.\n" );
                Flag = MIO_EQN_FLAG_ERROR; 
                break;
            }
            Flag = MIO_EQN_FLAG_VAR; 
            break;
        case MIO_EQN_SYM_NEG:
            if ( Flag == MIO_EQN_FLAG_VAR )
            {// if NEGBEF follows a variable, AND is assumed
                Vec_IntPush( pStackOp, MIO_EQN_OPER_AND );
                Flag = MIO_EQN_FLAG_OPER;
            }
            Vec_IntPush( pStackOp, MIO_EQN_OPER_NEG );
            break;
        case MIO_EQN_SYM_NEGAFT:
            if ( Flag != MIO_EQN_FLAG_VAR )
            {// if there is no variable before NEGAFT, it is an error
                fprintf( stdout, "Mio_ParseFormula(): No variable is specified before the negation suffix.\n" );
                Flag = MIO_EQN_FLAG_ERROR; 
                break;
            }
            else // if ( Flag == PARSE_FLAG_VAR )
                Vec_PtrPush( pStackFn, Exp_Not( (Vec_Int_t *)Vec_PtrPop(pStackFn) ) );
            break;
        case MIO_EQN_SYM_AND:
        case MIO_EQN_SYM_AND2:
        case MIO_EQN_SYM_OR:
        case MIO_EQN_SYM_OR2:
        case MIO_EQN_SYM_XOR:
            if ( Flag != MIO_EQN_FLAG_VAR )
            {
                fprintf( stdout, "Mio_ParseFormula(): There is no variable before AND, EXOR, or OR.\n" );
                Flag = MIO_EQN_FLAG_ERROR; 
                break;
            }
            if ( *pTemp == MIO_EQN_SYM_AND || *pTemp == MIO_EQN_SYM_AND2 )
                Vec_IntPush( pStackOp, MIO_EQN_OPER_AND );
            else if ( *pTemp == MIO_EQN_SYM_OR || *pTemp == MIO_EQN_SYM_OR2 )
                Vec_IntPush( pStackOp, MIO_EQN_OPER_OR );
            else //if ( *pTemp == MIO_EQN_SYM_XOR )
                Vec_IntPush( pStackOp, MIO_EQN_OPER_XOR );
            Flag = MIO_EQN_FLAG_OPER; 
            break;
        case MIO_EQN_SYM_OPEN:
            if ( Flag == MIO_EQN_FLAG_VAR )
            {
                Vec_IntPush( pStackOp, MIO_EQN_OPER_AND );
//                fprintf( stdout, "Mio_ParseFormula(): An opening parenthesis follows a var without operation sign.\n" ); 
//                Flag = MIO_EQN_FLAG_ERROR; 
//              break; 
            }
            Vec_IntPush( pStackOp, MIO_EQN_OPER_MARK );
            // after an opening bracket, it feels like starting over again
            Flag = MIO_EQN_FLAG_START; 
            break;
        case MIO_EQN_SYM_CLOSE:
            if ( Vec_IntSize( pStackOp ) != 0 )
            {
                while ( 1 )
                {
                    if ( Vec_IntSize( pStackOp ) == 0 )
                    {
                        fprintf( stdout, "Mio_ParseFormula(): There is no opening parenthesis\n" );
                        Flag = MIO_EQN_FLAG_ERROR; 
                        break;
                    }
                    Oper = Vec_IntPop( pStackOp );
                    if ( Oper == MIO_EQN_OPER_MARK )
                        break;

                    // perform the given operation
                    if ( Mio_ParseFormulaOper( pMan, nVars, pStackFn, Oper ) == NULL )
                    {
                        fprintf( stdout, "Mio_ParseFormula(): Unknown operation\n" );
                        ABC_FREE( pFormula );
                        Vec_PtrFreeP( &pStackFn );
                        Vec_IntFreeP( &pStackOp );
                        return NULL;
                    }
                }
            }
            else
            {
                fprintf( stdout, "Mio_ParseFormula(): There is no opening parenthesis\n" );
                Flag = MIO_EQN_FLAG_ERROR; 
                break;
            }
            if ( Flag != MIO_EQN_FLAG_ERROR )
                Flag = MIO_EQN_FLAG_VAR; 
            break;


        default:
            // scan the next name
            for ( i = 0; pTemp[i] && 
                         pTemp[i] != ' ' && pTemp[i] != '\t' && pTemp[i] != '\r' && pTemp[i] != '\n' &&
                         pTemp[i] != MIO_EQN_SYM_AND && pTemp[i] != MIO_EQN_SYM_AND2 && pTemp[i] != MIO_EQN_SYM_OR && pTemp[i] != MIO_EQN_SYM_OR2 && 
                         pTemp[i] != MIO_EQN_SYM_XOR && pTemp[i] != MIO_EQN_SYM_NEGAFT && pTemp[i] != MIO_EQN_SYM_CLOSE; 
                  i++ )
              {
                    if ( pTemp[i] == MIO_EQN_SYM_NEG || pTemp[i] == MIO_EQN_SYM_OPEN )
                    {
                        fprintf( stdout, "Mio_ParseFormula(): The negation sign or an opening parenthesis inside the variable name.\n" );
                        Flag = MIO_EQN_FLAG_ERROR; 
                        break;
                    }
              }
            // variable name is found
            fFound = 0;
//            Vec_PtrForEachEntry( char *, vVarNames, pName, v )
            for ( v = 0; v < nVars; v++ )
            {
                pName = ppVarNames[v];
                if ( strncmp(pTemp, pName, i) == 0 && strlen(pName) == (unsigned)i )
                {
                    pTemp += i-1;
                    fFound = 1;
                    break;
                }
            }
            if ( !fFound )
            { 
                fprintf( stdout, "Mio_ParseFormula(): The parser cannot find var \"%s\" in the input var list.\n", pTemp ); 
                Flag = MIO_EQN_FLAG_ERROR; 
                break; 
            }
/*
            if ( Flag == MIO_EQN_FLAG_VAR )
            {
                fprintf( stdout, "Mio_ParseFormula(): The variable name \"%s\" follows another var without operation sign.\n", pTemp ); 
                Flag = MIO_EQN_FLAG_ERROR; 
                break; 
            }
*/
            if ( Flag == MIO_EQN_FLAG_VAR )
                Vec_IntPush( pStackOp, MIO_EQN_OPER_AND );

            Vec_PtrPush( pStackFn, Exp_Var(v) ); // Cudd_Ref( pbVars[v] );
            Flag = MIO_EQN_FLAG_VAR; 
            break;
        }

        if ( Flag == MIO_EQN_FLAG_ERROR )
            break;      // error exit
        else if ( Flag == MIO_EQN_FLAG_START )
            continue;  //  go on parsing
        else if ( Flag == MIO_EQN_FLAG_VAR )
            while ( 1 )
            {  // check if there are negations in the OpStack     
                if ( Vec_IntSize( pStackOp ) == 0 )
                    break;
                Oper = Vec_IntPop( pStackOp );
                if ( Oper != MIO_EQN_OPER_NEG )
                {
                    Vec_IntPush( pStackOp, Oper );
                    break;
                }
                else
                {
                      Vec_PtrPush( pStackFn, Exp_Not((Vec_Int_t *)Vec_PtrPop(pStackFn)) );
                }
            }
        else // if ( Flag == MIO_EQN_FLAG_OPER )
            while ( 1 )
            {  // execute all the operations in the OpStack
               // with precedence higher or equal than the last one
                Oper1 = Vec_IntPop( pStackOp ); // the last operation
                if ( Vec_IntSize( pStackOp ) == 0 ) 
                {  // if it is the only operation, push it back
                    Vec_IntPush( pStackOp, Oper1 );
                    break;
                }
                Oper2 = Vec_IntPop( pStackOp ); // the operation before the last one
                if ( Oper2 >= Oper1 )  
                {  // if Oper2 precedence is higher or equal, execute it
                    if ( Mio_ParseFormulaOper( pMan, nVars, pStackFn, Oper2 ) == NULL )
                    {
                        fprintf( stdout, "Mio_ParseFormula(): Unknown operation\n" );
                        ABC_FREE( pFormula );
                        Vec_PtrFreeP( &pStackFn );
                        Vec_IntFreeP( &pStackOp );
                        return NULL;
                    }
                    Vec_IntPush( pStackOp,  Oper1 );     // push the last operation back
                }
                else
                {  // if Oper2 precedence is lower, push them back and done
                    Vec_IntPush( pStackOp, Oper2 );
                    Vec_IntPush( pStackOp, Oper1 );
                    break;
                }
            }
    }

    if ( Flag != MIO_EQN_FLAG_ERROR )
    {
        if ( Vec_PtrSize(pStackFn) != 0 )
        {    
            gFunc = (Vec_Int_t *)Vec_PtrPop(pStackFn);
            if ( Vec_PtrSize(pStackFn) == 0 )
                if ( Vec_IntSize( pStackOp ) == 0 )
                {
//                    Cudd_Deref( gFunc );
                    ABC_FREE( pFormula );
                    Vec_PtrFreeP( &pStackFn );
                    Vec_IntFreeP( &pStackOp );
                    return Exp_Reverse(gFunc);
                }
                else
                    fprintf( stdout, "Mio_ParseFormula(): Something is left in the operation stack\n" );
            else
                fprintf( stdout, "Mio_ParseFormula(): Something is left in the function stack\n" );
        }
        else
            fprintf( stdout, "Mio_ParseFormula(): The input string is empty\n" );
    }
    ABC_FREE( pFormula );
    Vec_PtrFreeP( &pStackFn );
    Vec_IntFreeP( &pStackOp );
    return NULL;
}